

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O0

void __thiscall db_packer::process(db_packer *this,cl_parser *cl)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  xr_writer *pxVar5;
  undefined8 uVar6;
  void *pvVar7;
  xr_memory_writer *this_00;
  reference ppdVar8;
  long lVar9;
  undefined8 uVar10;
  uint8_t *_text;
  undefined4 extraout_var;
  undefined1 local_520 [8];
  xr_scrambler scrambler_1;
  xr_scrambler scrambler;
  size_t size;
  uint8_t *data;
  db_file *file;
  iterator end_1;
  iterator it_1;
  iterator end;
  iterator it;
  xr_memory_writer *w;
  string local_d0;
  size_t local_b0;
  size_t num_params_1;
  size_t i_1;
  xr_reader *r;
  char *userdata;
  xr_file_system *fs;
  undefined4 local_80;
  uint version;
  undefined1 local_70 [8];
  string extension;
  string target;
  char *source;
  size_t num_params;
  size_t i;
  cl_parser *cl_local;
  db_packer *this_local;
  
  sVar3 = cl_parser::num_params(cl);
  if (sVar3 == 1) {
    num_params = 0;
    sVar3 = cl_parser::num_params(cl);
    for (; num_params != sVar3; num_params = num_params + 1) {
      pcVar4 = cl_parser::param(cl,0);
      bVar1 = xray_re::xr_file_system::folder_exist(pcVar4);
      if (!bVar1) {
        xray_re::msg("can\'t find %s",pcVar4);
        return;
      }
    }
    std::__cxx11::string::string((string *)(extension.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_70);
    bVar1 = cl_parser::get_string(cl,"-out",(string *)(extension.field_2._M_local_buf + 8));
    if (bVar1) {
      xray_re::xr_file_system::split_path
                ((string *)((long)&extension.field_2 + 8),(string *)0x0,(string *)0x0,
                 (string *)local_70);
      fs._4_4_ = 0;
      bVar1 = cl_parser::get_bool(cl,"-11xx");
      if (((bVar1) || (bVar1 = cl_parser::get_bool(cl,"-2215"), bVar1)) ||
         (bVar1 = cl_parser::get_bool(cl,"-2945"), bVar1)) {
        xray_re::msg("unsupported DB format");
        local_80 = 1;
      }
      else {
        bVar1 = cl_parser::get_bool(cl,"-2947ru");
        if (bVar1) {
          fs._4_4_ = fs._4_4_ | 8;
        }
        bVar1 = cl_parser::get_bool(cl,"-2947ww");
        if (bVar1) {
          fs._4_4_ = fs._4_4_ | 0x10;
        }
        bVar1 = cl_parser::get_bool(cl,"-xdb");
        if ((bVar1) || (bVar1 = db_tools::is_xdb((string *)local_70), bVar1)) {
          fs._4_4_ = fs._4_4_ | 0x20;
        }
        if ((fs._4_4_ == 0) || ((fs._4_4_ & fs._4_4_ - 1) != 0)) {
          xray_re::msg("unspecified DB format");
          local_80 = 1;
        }
        else {
          userdata = (char *)xray_re::xr_file_system::instance();
          pxVar5 = xray_re::xr_file_system::w_open
                             ((xr_file_system *)userdata,(string *)((long)&extension.field_2 + 8));
          this->m_archive = pxVar5;
          if (this->m_archive == (xr_writer *)0x0) {
            uVar6 = std::__cxx11::string::c_str();
            xray_re::msg("can\'t load %s",uVar6);
            local_80 = 1;
          }
          else {
            if ((fs._4_4_ == 0x20) &&
               (bVar1 = cl_parser::get_string(cl,"-xdb_ud",(char **)&r), bVar1)) {
              i_1 = (size_t)xray_re::xr_file_system::r_open((xr_file_system *)userdata,(char *)r);
              if ((xr_reader *)i_1 == (xr_reader *)0x0) {
                xray_re::msg("can\'t load %s");
              }
              else {
                xray_re::xr_writer::open_chunk(this->m_archive,0x29a);
                pxVar5 = this->m_archive;
                pvVar7 = xray_re::xr_reader::data((xr_reader *)i_1);
                sVar3 = xray_re::xr_reader::size((xr_reader *)i_1);
                (*pxVar5->_vptr_xr_writer[2])(pxVar5,pvVar7,sVar3);
                xray_re::xr_writer::close_chunk(this->m_archive);
                xray_re::xr_file_system::r_close((xr_file_system *)userdata,(xr_reader **)&i_1);
              }
            }
            xray_re::xr_writer::open_chunk(this->m_archive,0);
            num_params_1 = 0;
            local_b0 = cl_parser::num_params(cl);
            for (; num_params_1 != local_b0; num_params_1 = num_params_1 + 1) {
              pcVar4 = cl_parser::param(cl,num_params_1);
              std::__cxx11::string::operator=((string *)&this->m_root,pcVar4);
              xray_re::xr_strlwr(&this->m_root);
              xray_re::xr_file_system::append_path_separator(&this->m_root);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,"",(allocator<char> *)((long)&w + 7));
              process_folder(this,&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&w + 7));
            }
            xray_re::xr_writer::close_chunk(this->m_archive);
            this_00 = (xr_memory_writer *)operator_new(0x2078);
            xray_re::xr_memory_writer::xr_memory_writer(this_00);
            xray_re::msg("folders:");
            end = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(&this->m_folders);
            it_1._M_current =
                 (db_file **)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->m_folders);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&end,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&it_1), bVar1) {
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&end);
              lVar9 = std::__cxx11::string::size();
              xray_re::xr_writer::w_size_u16((xr_writer *)this_00,lVar9 + 0x10);
              xray_re::xr_writer::w_u32((xr_writer *)this_00,0);
              xray_re::xr_writer::w_u32((xr_writer *)this_00,0);
              xray_re::xr_writer::w_u32((xr_writer *)this_00,0);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&end);
              uVar6 = std::__cxx11::string::data();
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&end);
              uVar10 = std::__cxx11::string::size();
              (*(this_00->super_xr_writer)._vptr_xr_writer[2])(this_00,uVar6,uVar10);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&end);
              std::__cxx11::string::c_str();
              xray_re::msg("  %s");
              xray_re::xr_writer::w_u32((xr_writer *)this_00,0);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&end);
            }
            xray_re::msg("files: ");
            end_1 = std::vector<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>::begin
                              (&this->m_files);
            file = (db_file *)
                   std::vector<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>::end
                             (&this->m_files);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&end_1,(__normal_iterator<db_tools::db_file_**,_std::vector<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>_>
                                              *)&file), bVar1) {
              ppdVar8 = __gnu_cxx::
                        __normal_iterator<db_tools::db_file_**,_std::vector<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>_>
                        ::operator*(&end_1);
              data = (uint8_t *)*ppdVar8;
              lVar9 = std::__cxx11::string::size();
              xray_re::xr_writer::w_size_u16((xr_writer *)this_00,lVar9 + 0x10);
              xray_re::xr_writer::w_size_u32((xr_writer *)this_00,*(size_t *)(data + 0x28));
              xray_re::xr_writer::w_size_u32((xr_writer *)this_00,*(size_t *)(data + 0x30));
              xray_re::xr_writer::w_u32((xr_writer *)this_00,*(uint32_t *)(data + 0x38));
              uVar6 = std::__cxx11::string::data();
              uVar10 = std::__cxx11::string::size();
              (*(this_00->super_xr_writer)._vptr_xr_writer[2])(this_00,uVar6,uVar10);
              uVar6 = std::__cxx11::string::c_str();
              xray_re::msg("  %s",uVar6);
              xray_re::xr_writer::w_size_u32((xr_writer *)this_00,*(size_t *)(data + 0x20));
              __gnu_cxx::
              __normal_iterator<db_tools::db_file_**,_std::vector<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>_>
              ::operator++(&end_1);
            }
            size = 0;
            scrambler.m_dec_sbox[0xf8] = '\0';
            scrambler.m_dec_sbox[0xf9] = '\0';
            scrambler.m_dec_sbox[0xfa] = '\0';
            scrambler.m_dec_sbox[0xfb] = '\0';
            scrambler.m_dec_sbox[0xfc] = '\0';
            scrambler.m_dec_sbox[0xfd] = '\0';
            scrambler.m_dec_sbox[0xfe] = '\0';
            scrambler.m_dec_sbox[0xff] = '\0';
            _text = xray_re::xr_memory_writer::data(this_00);
            iVar2 = (*(this_00->super_xr_writer)._vptr_xr_writer[4])();
            xray_re::xr_lzhuf::compress
                      ((uint8_t **)&size,(size_t *)(scrambler.m_dec_sbox + 0xf8),_text,
                       CONCAT44(extraout_var,iVar2));
            if (this_00 != (xr_memory_writer *)0x0) {
              (*(this_00->super_xr_writer)._vptr_xr_writer[1])();
            }
            if (fs._4_4_ == 8) {
              xray_re::xr_scrambler::xr_scrambler
                        ((xr_scrambler *)(scrambler_1.m_dec_sbox + 0xf8),CC_RU);
              xray_re::xr_scrambler::encrypt
                        ((xr_scrambler *)(scrambler_1.m_dec_sbox + 0xf8),(char *)size,(int)size);
            }
            else if (fs._4_4_ == 0x10) {
              xray_re::xr_scrambler::xr_scrambler((xr_scrambler *)local_520,CC_WW);
              xray_re::xr_scrambler::encrypt((xr_scrambler *)local_520,(char *)size,(int)size);
            }
            xray_re::xr_writer::open_chunk(this->m_archive,0x80000001);
            (*this->m_archive->_vptr_xr_writer[2])
                      (this->m_archive,size,scrambler.m_dec_sbox._248_8_);
            xray_re::xr_writer::close_chunk(this->m_archive);
            if (size != 0) {
              operator_delete((void *)size,1);
            }
            xray_re::xr_file_system::w_close((xr_file_system *)userdata,&this->m_archive);
            local_80 = 0;
          }
        }
      }
    }
    else {
      xray_re::msg("unspecifed output file");
      local_80 = 1;
    }
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(extension.field_2._M_local_buf + 8));
  }
  else {
    xray_re::msg("incorrect number of parameters");
  }
  return;
}

Assistant:

void db_packer::process(const cl_parser& cl)
{
	if (cl.num_params() != 1) {
		msg("incorrect number of parameters");
		return;
	}

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(0);
		if (!xr_file_system::folder_exist(source)) {
			msg("can't find %s", source);
			return;
		}
	}

	std::string target, extension;
	if (!cl.get_string("-out", target)) {
		msg("unspecifed output file");
		return;
	}
	xr_file_system::split_path(target, 0, 0, &extension);

	unsigned version = DB_VERSION_AUTO;
	if (cl.get_bool("-11xx") || cl.get_bool("-2215") || cl.get_bool("-2945")) {
		msg("unsupported DB format");
		return;
	}
	if (cl.get_bool("-2947ru"))
		version |= DB_VERSION_2947RU;
	if (cl.get_bool("-2947ww"))
		version |= DB_VERSION_2947WW;
	if (cl.get_bool("-xdb") || is_xdb(extension))
		version |= DB_VERSION_XDB;
	if (version == DB_VERSION_AUTO || (version & (version - 1)) != 0) {
		msg("unspecified DB format");
		return;
	}

	xr_file_system& fs = xr_file_system::instance();
	m_archive = fs.w_open(target);
	if (m_archive == 0) {
		msg("can't load %s", target.c_str());
		return;
	}

	const char* userdata;
	if (version == DB_VERSION_XDB && cl.get_string("-xdb_ud", userdata)) {
		if (xr_reader* r = fs.r_open(userdata)) {
			m_archive->open_chunk(DB_CHUNK_USERDATA);
			m_archive->w_raw(r->data(), r->size());
			m_archive->close_chunk();
			fs.r_close(r);
		} else {
			msg("can't load %s", userdata);
		}
	}

	m_archive->open_chunk(DB_CHUNK_DATA);
	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		m_root = cl.param(i);
		xr_strlwr(m_root);
		xr_file_system::append_path_separator(m_root);
		process_folder();
	}
	m_archive->close_chunk();

	xr_memory_writer* w = new xr_memory_writer;
	msg("folders:");
	for (std::vector<std::string>::iterator it = m_folders.begin(),
			end = m_folders.end(); it != end; ++it) {
		w->w_size_u16(it->size() + 16);
		w->w_u32(0);
		w->w_u32(0);
		w->w_u32(0);
		w->w_raw(it->data(), it->size());
		msg("  %s", it->c_str());
		w->w_u32(0);
	}
	msg("files: ");
	for (std::vector<db_file*>::iterator it = m_files.begin(),
			end = m_files.end(); it != end; ++it) {
		db_file* file = *it;
		w->w_size_u16(file->path.size() + 16);
		w->w_size_u32(file->size_real);
		w->w_size_u32(file->size_compressed);
		w->w_u32(file->crc);
		w->w_raw(file->path.data(), file->path.size());
		msg("  %s", file->path.c_str());
		w->w_size_u32(file->offset);
	}
	uint8_t* data = 0;
	size_t size = 0;
	xr_lzhuf::compress(data, size, w->data(), w->tell());
	delete w;
	if (version == DB_VERSION_2947RU) {
		xr_scrambler scrambler(xr_scrambler::CC_RU);
		scrambler.encrypt(data, data, size);
	} else if (version == DB_VERSION_2947WW) {
		xr_scrambler scrambler(xr_scrambler::CC_WW);
		scrambler.encrypt(data, data, size);
	}
	m_archive->open_chunk(DB_CHUNK_HEADER|xr_reader::CHUNK_COMPRESSED);
	m_archive->w_raw(data, size);
	m_archive->close_chunk();
	delete data;
	fs.w_close(m_archive);
}